

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

bool __thiscall
vkt::image::anon_unknown_2::BinaryAtomicEndResultInstance::verifyResult
          (BinaryAtomicEndResultInstance *this,Allocation *outputBufferAllocation)

{
  AtomicOperation op;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  deInt32 dVar7;
  void *data;
  int *piVar8;
  byte local_ed;
  undefined1 local_a8 [8];
  IVec3 gid_1;
  deInt32 i_1;
  bool matchFound;
  IVec3 gid;
  deInt32 i;
  deInt32 reference;
  int local_70;
  int local_6c;
  deInt32 resultValue;
  deInt32 x;
  deInt32 y;
  deInt32 z;
  ConstPixelBufferAccess resultBuffer;
  IVec3 extendedGridSize;
  UVec3 gridSize;
  Allocation *outputBufferAllocation_local;
  BinaryAtomicEndResultInstance *this_local;
  
  getShaderGridSize((image *)(extendedGridSize.m_data + 1),
                    (this->super_BinaryAtomicInstanceBase).m_imageType,
                    &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  uVar2 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
  uVar3 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
  uVar4 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&resultBuffer.m_data,uVar2 * 5,uVar3,uVar4);
  uVar2 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
  uVar3 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
  uVar4 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
  data = ::vk::Allocation::getHostPtr(outputBufferAllocation);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&y,&(this->super_BinaryAtomicInstanceBase).m_format,uVar2,
             uVar3,uVar4,data);
  x = 0;
  do {
    dVar7 = x;
    iVar5 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&y);
    if (iVar5 <= dVar7) {
      return true;
    }
    for (resultValue = 0; dVar7 = resultValue,
        iVar5 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&y), dVar7 < iVar5;
        resultValue = resultValue + 1) {
      for (local_6c = 0; iVar5 = local_6c,
          iVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&y), iVar5 < iVar6
          ; local_6c = local_6c + 1) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)&i,(int)&y,local_6c,resultValue);
        piVar8 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&i);
        local_70 = *piVar8;
        bVar1 = isOrderIndependentAtomicOperation
                          ((this->super_BinaryAtomicInstanceBase).m_operation);
        if (bVar1) {
          gid.m_data[2] =
               getOperationInitialValue((this->super_BinaryAtomicInstanceBase).m_operation);
          for (gid.m_data[1] = 0; iVar6 = local_6c, iVar5 = gid.m_data[1], gid.m_data[1] < 5;
              gid.m_data[1] = gid.m_data[1] + 1) {
            uVar2 = tcu::Vector<unsigned_int,_3>::x
                              ((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
            tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&i_1,iVar6 + iVar5 * uVar2,resultValue,x);
            iVar5 = gid.m_data[2];
            op = (this->super_BinaryAtomicInstanceBase).m_operation;
            dVar7 = getAtomicFuncArgument
                              ((this->super_BinaryAtomicInstanceBase).m_operation,(IVec3 *)&i_1,
                               (IVec3 *)&resultBuffer.m_data);
            gid.m_data[2] = computeBinaryAtomicOperationResult(op,iVar5,dVar7);
          }
          if (local_70 != gid.m_data[2]) {
            return false;
          }
        }
        else if ((this->super_BinaryAtomicInstanceBase).m_operation == ATOMIC_OPERATION_EXCHANGE) {
          gid_1.m_data[2]._3_1_ = false;
          gid_1.m_data[1] = 0;
          while( true ) {
            iVar6 = local_6c;
            iVar5 = gid_1.m_data[1];
            local_ed = 0;
            if (gid_1.m_data[1] < 5) {
              local_ed = gid_1.m_data[2]._3_1_ ^ 0xff;
            }
            if ((local_ed & 1) == 0) break;
            uVar2 = tcu::Vector<unsigned_int,_3>::x
                              ((Vector<unsigned_int,_3> *)(extendedGridSize.m_data + 1));
            tcu::Vector<int,_3>::Vector
                      ((Vector<int,_3> *)local_a8,iVar6 + iVar5 * uVar2,resultValue,x);
            iVar5 = local_70;
            dVar7 = getAtomicFuncArgument
                              ((this->super_BinaryAtomicInstanceBase).m_operation,(IVec3 *)local_a8,
                               (IVec3 *)&resultBuffer.m_data);
            gid_1.m_data[2]._3_1_ = iVar5 == dVar7;
            gid_1.m_data[1] = gid_1.m_data[1] + 1;
          }
          if ((bool)gid_1.m_data[2]._3_1_ == false) {
            return false;
          }
        }
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool BinaryAtomicEndResultInstance::verifyResult (Allocation& outputBufferAllocation) const
{
	const UVec3	gridSize			= getShaderGridSize(m_imageType, m_imageSize);
	const IVec3 extendedGridSize	= IVec3(NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	tcu::ConstPixelBufferAccess resultBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputBufferAllocation.getHostPtr());

	for (deInt32 z = 0; z < resultBuffer.getDepth();  z++)
	for (deInt32 y = 0; y < resultBuffer.getHeight(); y++)
	for (deInt32 x = 0; x < resultBuffer.getWidth();  x++)
	{
		deInt32 resultValue = resultBuffer.getPixelInt(x, y, z).x();

		if (isOrderIndependentAtomicOperation(m_operation))
		{
			deInt32 reference = getOperationInitialValue(m_operation);

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL); i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				reference = computeBinaryAtomicOperationResult(m_operation, reference, getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (resultValue != reference)
				return false;
		}
		else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
		{
			// Check if the end result equals one of the atomic args.
			bool matchFound = false;

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL) && !matchFound; i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				matchFound = (resultValue == getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (!matchFound)
				return false;
		}
		else
			DE_ASSERT(false);
	}
	return true;
}